

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O1

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  int iVar1;
  long lVar2;
  size_t __size;
  ogg_uint32_t *poVar3;
  ogg_uint32_t *poVar4;
  float *pfVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  size_t sVar22;
  int *sparsemap;
  undefined1 *__base;
  int aiStack_50 [2];
  ogg_uint32_t *local_48;
  int local_3c;
  size_t local_38;
  
  c->quantvals = 0;
  c->minval = 0;
  *(undefined8 *)&c->delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (float *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  c->c = (static_codebook *)0x0;
  c->dim = 0;
  c->entries = 0;
  lVar8 = s->entries;
  iVar14 = 0;
  uVar20 = 0;
  if (0 < lVar8) {
    lVar12 = 0;
    uVar20 = 0;
    do {
      uVar20 = uVar20 + ('\0' < s->lengthlist[lVar12]);
      lVar12 = lVar12 + 1;
    } while (lVar8 != lVar12);
  }
  c->entries = lVar8;
  sVar22 = (size_t)(int)uVar20;
  c->used_entries = sVar22;
  c->dim = s->dim;
  if (0 < (int)uVar20) {
    aiStack_50[0] = 0x1d9e17;
    aiStack_50[1] = 0;
    poVar3 = _make_words(s->lengthlist,lVar8,sVar22);
    lVar8 = -(sVar22 * 8 + 0xf & 0xfffffffffffffff0);
    __base = (undefined1 *)((long)&local_48 + lVar8);
    sparsemap = (int *)__base;
    if (poVar3 != (ogg_uint32_t *)0x0) {
      lVar12 = 0;
      do {
        uVar15 = *(uint *)((long)poVar3 + lVar12);
        uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 | uVar15 << 0x18
        ;
        uVar15 = (uVar15 & 0xf0f0f0f) << 4 | uVar15 >> 4 & 0xf0f0f0f;
        uVar15 = (uVar15 >> 2 & 0x33333333) + (uVar15 & 0x33333333) * 4;
        *(uint *)((long)poVar3 + lVar12) = (uVar15 >> 1 & 0x55555555) + (uVar15 & 0x55555555) * 2;
        *(long *)(__base + lVar12 * 2) = (long)poVar3 + lVar12;
        lVar12 = lVar12 + 4;
      } while (sVar22 * 4 - lVar12 != 0);
      local_48 = poVar3;
      local_38 = sVar22 * 4;
      *(undefined8 *)((long)aiStack_50 + lVar8) = 0x1d9ebf;
      qsort(__base,sVar22,8,sort32a);
      __size = local_38;
      sparsemap = (int *)(__base + -(sVar22 * 4 + 0xf & 0xfffffffffffffff0));
      sparsemap[-2] = 0x1d9ee0;
      sparsemap[-1] = 0;
      poVar4 = (ogg_uint32_t *)malloc(__size);
      poVar3 = local_48;
      c->codelist = poVar4;
      uVar10 = 1;
      if (1 < (int)uVar20) {
        uVar10 = (ulong)uVar20;
      }
      uVar13 = 0;
      do {
        sparsemap[(int)((ulong)(*(long *)(__base + uVar13 * 8) - (long)poVar3) >> 2)] = (int)uVar13;
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      uVar13 = 0;
      do {
        poVar4[sparsemap[uVar13]] = poVar3[uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar10 != uVar13);
      sparsemap[-2] = 0x1d9f2d;
      sparsemap[-1] = 0;
      free(poVar3);
      sparsemap[-2] = 0x1d9f3b;
      sparsemap[-1] = 0;
      pfVar5 = _book_unquantize(s,uVar20,sparsemap);
      sVar22 = local_38;
      c->valuelist = pfVar5;
      sparsemap[-2] = 0x1d9f48;
      sparsemap[-1] = 0;
      piVar6 = (int *)malloc(sVar22);
      c->dec_index = piVar6;
      lVar8 = s->entries;
      uVar20 = 0;
      if (lVar8 < 1) {
        sVar22 = 0;
      }
      else {
        pcVar7 = s->lengthlist;
        lVar12 = 0;
        iVar14 = 0;
        do {
          if ('\0' < pcVar7[lVar12]) {
            lVar16 = (long)iVar14;
            iVar14 = iVar14 + 1;
            piVar6[sparsemap[lVar16]] = (int)lVar12;
          }
          lVar12 = lVar12 + 1;
        } while (lVar8 != lVar12);
        sVar22 = (size_t)iVar14;
      }
      sparsemap[-2] = 0x1d9f88;
      sparsemap[-1] = 0;
      pcVar7 = (char *)malloc(sVar22);
      c->dec_codelengths = pcVar7;
      c->dec_maxlength = 0;
      if (0 < s->entries) {
        lVar8 = 0;
        uVar20 = 0;
        do {
          if ('\0' < s->lengthlist[lVar8]) {
            lVar12 = (long)(int)uVar20;
            uVar20 = uVar20 + 1;
            c->dec_codelengths[sparsemap[lVar12]] = s->lengthlist[lVar8];
            if (c->dec_maxlength < (int)s->lengthlist[lVar8]) {
              c->dec_maxlength = (int)s->lengthlist[lVar8];
            }
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < s->entries);
      }
      if ((uVar20 == 1) && (c->dec_maxlength == 1)) {
        c->dec_firsttablen = 1;
        sparsemap[-2] = 0x1d9ff7;
        sparsemap[-1] = 0;
        poVar3 = (ogg_uint32_t *)calloc(2,4);
        c->dec_firsttable = poVar3;
        poVar3[0] = 1;
        poVar3[1] = 1;
      }
      else {
        uVar15 = (uint)c->used_entries;
        uVar9 = 0x1f;
        if (uVar15 != 0) {
          for (; uVar15 >> uVar9 == 0; uVar9 = uVar9 - 1) {
          }
        }
        uVar9 = (uVar9 ^ 0xffffffe0) + 0x21;
        if (uVar15 == 0) {
          uVar9 = 0;
        }
        uVar15 = 0xc;
        if ((int)uVar9 < 0xc) {
          uVar15 = uVar9;
        }
        local_3c = 5;
        if (8 < uVar9) {
          local_3c = uVar15 - 4;
        }
        c->dec_firsttablen = local_3c;
        uVar15 = 1 << ((byte)local_3c & 0x1f);
        sparsemap[-2] = 0x1da053;
        sparsemap[-1] = 0;
        poVar3 = (ogg_uint32_t *)calloc((ulong)uVar15,4);
        c->dec_firsttable = poVar3;
        if (0 < (int)uVar20) {
          pcVar7 = c->dec_codelengths;
          iVar14 = c->dec_firsttablen;
          local_38 = CONCAT44(local_38._4_4_,iVar14);
          uVar10 = 0;
          do {
            if (pcVar7[uVar10] <= iVar14) {
              iVar1 = c->dec_firsttablen;
              iVar11 = (int)pcVar7[uVar10];
              if (iVar1 - iVar11 != 0x1f) {
                uVar9 = c->codelist[uVar10];
                uVar9 = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 |
                        uVar9 << 0x18;
                uVar9 = (uVar9 & 0xf0f0f0f) << 4 | uVar9 >> 4 & 0xf0f0f0f;
                uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333) * 4;
                iVar21 = 0;
                do {
                  poVar3[iVar21 << ((byte)iVar11 & 0x1f) |
                         (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555) * 2] = (int)uVar10 + 1;
                  iVar21 = iVar21 + 1;
                  iVar11 = (int)pcVar7[uVar10];
                } while (iVar21 < 1 << ((char)iVar1 - pcVar7[uVar10] & 0x1fU));
              }
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != uVar20);
        }
        iVar14 = 0x20 - c->dec_firsttablen;
        lVar12 = (long)(int)uVar20;
        uVar20 = 0;
        uVar10 = 0;
        local_38 = CONCAT44(local_38._4_4_,iVar14);
        lVar8 = 0;
        do {
          uVar19 = uVar20 << ((byte)iVar14 & 0x1f);
          uVar9 = uVar19 >> 0x18 | (uVar19 & 0xff0000) >> 8 | (uVar19 & 0xff00) << 8 |
                  uVar19 << 0x18;
          uVar9 = (uVar9 & 0xf0f0f0f) << 4 | uVar9 >> 4 & 0xf0f0f0f;
          uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333) * 4;
          uVar9 = (uVar9 >> 1 & 0x55555555) + (uVar9 & 0x55555555) * 2;
          lVar16 = lVar8;
          if (poVar3[uVar9] == 0) {
            lVar18 = uVar10 + 1;
            if ((long)(uVar10 + 1) <= lVar12) {
              lVar18 = lVar12;
            }
            uVar13 = uVar10 - 1;
            do {
              uVar10 = lVar18 - 1;
              if ((1 - lVar18) + uVar13 == -1) break;
              uVar10 = uVar13 + 1;
              lVar2 = uVar13 + 2;
              uVar13 = uVar10;
            } while (c->codelist[lVar2] <= uVar19);
            if (lVar8 < lVar12) {
              do {
                lVar16 = lVar8;
                if (uVar19 < (c->codelist[lVar8] &
                             (uint)(0xfffffffeL << (0x1fU - (char)local_3c & 0x3f)))) break;
                lVar8 = lVar8 + 1;
                lVar16 = lVar12;
              } while (lVar12 != lVar8);
            }
            uVar17 = lVar12 - lVar16;
            uVar13 = 0x7fff;
            if (uVar10 < 0x7fff) {
              uVar13 = uVar10;
            }
            if (0x7ffe < uVar17) {
              uVar17 = 0x7fff;
            }
            poVar3[uVar9] = (uint)uVar17 | (int)uVar13 << 0xf | 0x80000000;
          }
          uVar20 = uVar20 + 1;
          lVar8 = lVar16;
        } while (uVar20 != uVar15);
      }
      if (local_48 != (ogg_uint32_t *)0x0) {
        return 0;
      }
    }
    sparsemap[-2] = 0x1da25d;
    sparsemap[-1] = 0;
    vorbis_book_clear(c);
    iVar14 = -1;
  }
  return iVar14;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;

  memset(c,0,sizeof(*c));

  /* count actually used entries and find max length */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.

    First, we collapse the likely sparse codebook down only to
    actually represented values/words.  This collapsing needs to be
    indexed as map-valueless books are used to encode original entry
    positions as integers.

    Second, we reorder all vectors, including the entry index above,
    by sorted bitreversed codeword to allow treeless decode. */

    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=alloca(sizeof(*codep)*n);

    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=alloca(n*sizeof(*sortindex));
    c->codelist=_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);

    c->valuelist=_book_unquantize(s,n,sortindex);
    c->dec_index=_ogg_malloc(n*sizeof(*c->dec_index));

    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
        c->dec_index[sortindex[n++]]=i;

    c->dec_codelengths=_ogg_malloc(n*sizeof(*c->dec_codelengths));
    c->dec_maxlength=0;
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0){
        c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
        if(s->lengthlist[i]>c->dec_maxlength)
          c->dec_maxlength=s->lengthlist[i];
      }

    if(n==1 && c->dec_maxlength==1){
      /* special case the 'single entry codebook' with a single bit
       fastpath table (that always returns entry 0 )in order to use
       unmodified decode paths. */
      c->dec_firsttablen=1;
      c->dec_firsttable=_ogg_calloc(2,sizeof(*c->dec_firsttable));
      c->dec_firsttable[0]=c->dec_firsttable[1]=1;

    }else{
      c->dec_firsttablen=ov_ilog(c->used_entries)-4; /* this is magic */
      if(c->dec_firsttablen<5)c->dec_firsttablen=5;
      if(c->dec_firsttablen>8)c->dec_firsttablen=8;

      tabn=1<<c->dec_firsttablen;
      c->dec_firsttable=_ogg_calloc(tabn,sizeof(*c->dec_firsttable));

      for(i=0;i<n;i++){
        if(c->dec_codelengths[i]<=c->dec_firsttablen){
          ogg_uint32_t orig=bitreverse(c->codelist[i]);
          for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
            c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
        }
      }

      /* now fill in 'unused' entries in the firsttable with hi/lo search
         hints for the non-direct-hits */
      {
        ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
        long lo=0,hi=0;

        for(i=0;i<tabn;i++){
          ogg_uint32_t word=i<<(32-c->dec_firsttablen);
          if(c->dec_firsttable[bitreverse(word)]==0){
            while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
            while(    hi<n && word>=(c->codelist[hi]&mask))hi++;

            /* we only actually have 15 bits per hint to play with here.
               In order to overflow gracefully (nothing breaks, efficiency
               just drops), encode as the difference from the extremes. */
            {
              unsigned long loval=lo;
              unsigned long hival=n-hi;

              if(loval>0x7fff)loval=0x7fff;
              if(hival>0x7fff)hival=0x7fff;
              c->dec_firsttable[bitreverse(word)]=
                0x80000000UL | (loval<<15) | hival;
            }
          }
        }
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}